

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  undefined8 in_RSI;
  int in_EDI;
  MemoryStatus memory_status;
  int c;
  CPU_MODE cpu_mode;
  MEMORY_MODE mem_mode;
  bool segments_to_right;
  bool segments_to_left;
  bool use_vert_graph;
  bool use_powerline_right;
  bool use_powerline_left;
  bool use_colors;
  short right_color;
  short left_color;
  short graph_lines;
  short averages_count;
  uint cpu_usage_delay;
  bool in_stack_00000120;
  bool in_stack_00000121;
  bool in_stack_00000122;
  bool in_stack_00000123;
  uint in_stack_00000124;
  uint in_stack_00000128;
  CPU_MODE in_stack_0000012c;
  bool in_stack_00000140;
  bool in_stack_00000141;
  bool in_stack_00000142;
  bool in_stack_00000143;
  MEMORY_MODE in_stack_00000144;
  MemoryStatus *in_stack_00000148;
  short in_stack_00000168;
  MemoryStatus *in_stack_00000270;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [40];
  int local_30;
  int local_2c;
  int local_28;
  byte local_22;
  undefined1 local_21;
  undefined1 local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  undefined2 local_16;
  int local_14;
  undefined8 local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_14 = 990000;
  local_16 = 3;
  local_18 = 10;
  local_1a = 0;
  local_1c = 0;
  local_1d = 0;
  local_1e = 0;
  local_1f = 0;
  local_20 = 0;
  local_21 = 0;
  local_22 = 0;
  local_28 = 0;
  local_2c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    local_30 = getopt_long(local_8,local_10,"hi:cpqvl:r:g:m:a:t:",main::long_options,0);
    if (local_30 == -1) {
      bVar1 = local_8 <= _optind;
      if (bVar1) {
        mem_status(in_stack_00000270);
        mem_string_abi_cxx11_
                  (in_stack_00000148,in_stack_00000144,in_stack_00000143,in_stack_00000142,
                   in_stack_00000141,in_stack_00000140,in_stack_00000168);
        poVar3 = std::operator<<((ostream *)&std::cout,local_58);
        cpu_string_abi_cxx11_
                  (in_stack_0000012c,in_stack_00000128,in_stack_00000124,in_stack_00000123,
                   in_stack_00000122,in_stack_00000121,in_stack_00000120);
        poVar3 = std::operator<<(poVar3,local_88);
        load_string_abi_cxx11_
                  (SUB81(local_a8,0),(bool)(local_1d & 1),(bool)(local_1e & 1),local_1f & 1,
                   SUB21(local_16,0),local_22 & 1);
        std::operator<<(poVar3,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::~string(local_58);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,
                        "The interval and graph lines options are now specified with flags.\n\n");
        print_help();
      }
      local_4 = (uint)!bVar1;
      return local_4;
    }
    switch(local_30) {
    case 0x3f:
      return 1;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"?? getopt returned character code 0 ");
      this = (void *)std::ostream::operator<<(poVar3,local_30);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      return 1;
    case 0x61:
      iVar2 = atoi(_optarg);
      if ((iVar2 < 0) || (iVar2 = atoi(_optarg), 3 < iVar2)) {
        std::operator<<((ostream *)&std::cerr,"Valid averages-count arguments are: 0, 1, 2, 3\n");
        return 1;
      }
      iVar2 = atoi(_optarg);
      local_16 = (undefined2)iVar2;
      break;
    case 99:
      local_1d = 1;
      break;
    case 0x67:
      iVar2 = atoi(_optarg);
      if (iVar2 < 0) {
        std::operator<<((ostream *)&std::cerr,"Graph lines argument must be zero or greater.\n");
        return 1;
      }
      iVar2 = atoi(_optarg);
      local_18 = (undefined2)iVar2;
      break;
    case 0x68:
      print_help();
      return 1;
    case 0x69:
      iVar2 = atoi(_optarg);
      if (iVar2 < 1) {
        std::operator<<((ostream *)&std::cerr,"Status interval argument must be one or greater.\n");
        return 1;
      }
      iVar2 = atoi(_optarg);
      local_14 = iVar2 * 1000000 + -10000;
      break;
    case 0x6c:
      local_21 = 1;
      iVar2 = atoi(_optarg);
      if ((iVar2 < 0) || (iVar2 = atoi(_optarg), 0xff < iVar2)) {
        std::operator<<((ostream *)&std::cerr,"Valid color vaues are from 0 to 255.\n");
        return 1;
      }
      iVar2 = atoi(_optarg);
      local_1a = (undefined2)iVar2;
      break;
    case 0x6d:
      iVar2 = atoi(_optarg);
      if (iVar2 < 0) {
        std::operator<<((ostream *)&std::cerr,"Memory mode argument must be zero or greater.\n");
        return 1;
      }
      local_28 = atoi(_optarg);
      break;
    case 0x70:
      local_1d = 1;
      local_1e = 1;
      break;
    case 0x71:
      local_1d = 1;
      local_1f = 1;
      break;
    case 0x72:
      local_22 = 1;
      iVar2 = atoi(_optarg);
      if ((iVar2 < 0) || (iVar2 = atoi(_optarg), 0xff < iVar2)) {
        std::operator<<((ostream *)&std::cerr,"Valid color vaues are from 0 to 255.\n");
        return 1;
      }
      iVar2 = atoi(_optarg);
      local_1c = (undefined2)iVar2;
      break;
    case 0x74:
      iVar2 = atoi(_optarg);
      if (iVar2 < 0) {
        std::operator<<((ostream *)&std::cerr,"CPU mode argument must be zero or greater.\n");
        return 1;
      }
      local_2c = atoi(_optarg);
      break;
    case 0x76:
      local_20 = 1;
    }
  } while( true );
}

Assistant:

int main( int argc, char** argv )
{
  unsigned cpu_usage_delay = 990000;
  short averages_count = 3;
  short graph_lines = 10; // max 32767 should be enough
  short left_color = 0;
  short right_color = 0;
  bool use_colors = false;
  bool use_powerline_left = false;
  bool use_powerline_right = false;
  bool use_vert_graph = false;
  bool segments_to_left = false;
  bool segments_to_right= false;
  MEMORY_MODE mem_mode = MEMORY_MODE_DEFAULT;
  CPU_MODE cpu_mode = CPU_MODE_DEFAULT;

  static struct option long_options[] =
  {
    // Struct is a s follows:
    //   const char * name, int has_arg, int *flag, int val
    // if *flag is null, val is option identifier to use in switch()
    // otherwise it's a value to set the variable *flag points to
    { "help", no_argument, NULL, 'h' },
    { "colors", no_argument, NULL, 'c' },
    { "powerline-left", no_argument, NULL, 'p' },
    { "powerline-right", no_argument, NULL, 'q' },
    { "vertical-graph", no_argument, NULL, 'v' },
    { "interval", required_argument, NULL, 'i' },
    { "graph-lines", required_argument, NULL, 'g' },
    { "mem-mode", required_argument, NULL, 'm' },
    { "cpu-mode", required_argument, NULL, 't' },
    { "averages-count", required_argument, NULL, 'a' },
    { "segments-left", required_argument, NULL, 'l' },
    { "segments-right", required_argument, NULL, 'r' },
    { 0, 0, 0, 0 } // used to handle unknown long options
  };

  int c;
  // while c != -1
  while( (c = getopt_long( argc, argv, "hi:cpqvl:r:g:m:a:t:", long_options, NULL) ) != -1 )
  {
    switch( c )
    {
      case 'h': // --help, -h
        print_help();
        return EXIT_FAILURE;
        break;
      case 'c': // --colors
        use_colors = true;
        break;
      case 'p': // --powerline-left
        use_colors = true;
        use_powerline_left = true;
        break;
      case 'q': // --powerline-right
        use_colors = true;
        use_powerline_right = true;
        break;
      case 'v': // --vertical-graph
        use_vert_graph = true;
        break;
      case 'l': // --segments-left
        segments_to_left = true;
        if( atoi( optarg ) < 0 || atoi( optarg ) > 255 )
        {
          std::cerr << "Valid color vaues are from 0 to 255.\n";
          return EXIT_FAILURE;
        }
        left_color = atoi( optarg ) ;
        break;
      case 'r': // --segments-right
        segments_to_right= true;
        if( atoi( optarg ) < 0 || atoi( optarg ) > 255 )
        {
          std::cerr << "Valid color vaues are from 0 to 255.\n";
          return EXIT_FAILURE;
        }
        right_color = atoi( optarg ) ;
        break;
      case 'i': // --interval, -i
        if( atoi( optarg ) < 1 )
          {
            std::cerr << "Status interval argument must be one or greater.\n";
            return EXIT_FAILURE;
          }
        cpu_usage_delay = atoi( optarg ) * 1000000 - 10000;
        break;
      case 'g': // --graph-lines, -g
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "Graph lines argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        graph_lines = atoi( optarg );
        break;
      case 'm': // --mem-mode, -m
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "Memory mode argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        mem_mode = static_cast< MEMORY_MODE >( atoi( optarg ) );
        break;
      case 't': // --cpu-mode, -t
        if( atoi( optarg ) < 0 )
          {
            std::cerr << "CPU mode argument must be zero or greater.\n";
            return EXIT_FAILURE;
          }
        cpu_mode = static_cast< CPU_MODE >( atoi( optarg ) );
        break;
      case 'a': // --averages-count, -a
        if( atoi( optarg ) < 0 || atoi( optarg ) > 3 )
          {
            std::cerr << "Valid averages-count arguments are: 0, 1, 2, 3\n";
            return EXIT_FAILURE;
          }
        averages_count = atoi( optarg );
        break;
      case '?':
        // getopt_long prints error message automatically
        return EXIT_FAILURE;
        break;
      default:
        std::cerr << "?? getopt returned character code 0 " << c << std::endl;
        return EXIT_FAILURE;
    }
  }
  // Detect old option specification and return and error message.
  if( argc > optind )
  {
    std::cout <<
      "The interval and graph lines options are now specified with flags.\n\n";
    print_help();
    return EXIT_FAILURE;
  }

  MemoryStatus memory_status;
  mem_status( memory_status );
  std::cout << mem_string( memory_status, mem_mode, use_colors, use_powerline_left, use_powerline_right, segments_to_left, left_color )
    << cpu_string( cpu_mode, cpu_usage_delay, graph_lines, use_colors, use_powerline_left, use_powerline_right, use_vert_graph )
    << load_string( use_colors, use_powerline_left, use_powerline_right, averages_count, segments_to_right, right_color );

  std::cout << std::endl;

  return EXIT_SUCCESS;
}